

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplifyDual(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,bool *again)

{
  uint *puVar1;
  undefined8 *puVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DataKey *pDVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined8 uVar10;
  SPxOut *pSVar11;
  int *piVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  _Var16;
  int iVar17;
  int iVar18;
  FreeConstraintPS *this_00;
  pointer pnVar19;
  FixBoundsPS *pFVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  Result RVar22;
  uint uVar23;
  Item *pIVar24;
  double dVar25;
  double dVar26;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  cpp_dec_float<50u,int,void> *this_01;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long in_FS_OFFSET;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsLo;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarLo;
  DataArray<bool> colSingleton;
  undefined1 local_6e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6e0;
  uint local_6d8 [3];
  undefined3 uStack_6cb;
  uint local_6c8;
  undefined3 uStack_6c3;
  int local_6c0;
  bool local_6bc;
  double local_6b8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6b0;
  undefined1 local_6a8 [16];
  uint local_698 [3];
  undefined3 uStack_68b;
  uint local_688;
  undefined3 uStack_683;
  int local_680;
  bool local_67c;
  undefined8 local_678;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_668;
  int local_65c;
  double local_658;
  undefined8 uStack_650;
  undefined1 local_648 [16];
  uint local_638 [3];
  undefined3 uStack_62b;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  int local_620;
  bool local_61c;
  undefined8 local_618;
  int local_60c;
  double local_608;
  undefined8 uStack_600;
  Item *local_5f8;
  int local_5ec;
  double local_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [40];
  int local_5b0;
  bool local_5ac;
  double local_5a8;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_5a0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_598;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_580;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_568;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_550;
  shared_ptr<soplex::Tolerances> local_538;
  shared_ptr<soplex::Tolerances> local_528;
  shared_ptr<soplex::Tolerances> local_518;
  shared_ptr<soplex::Tolerances> local_508;
  shared_ptr<soplex::Tolerances> local_4f8;
  element_type *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4e0;
  uint local_4d8 [2];
  undefined8 uStack_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  undefined1 local_4b8 [29];
  undefined3 uStack_49b;
  undefined1 auStack_498 [13];
  undefined8 local_488;
  bool *local_478;
  long local_470;
  long local_468;
  int local_460;
  int local_45c;
  bool *local_458;
  undefined8 local_450;
  double local_448;
  undefined8 uStack_440;
  double local_438;
  undefined8 uStack_430;
  uint local_428 [2];
  uint auStack_420 [2];
  uint local_418 [2];
  uint auStack_410 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  uint local_3e8 [2];
  undefined8 uStack_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  uint local_3c8 [2];
  uint auStack_3c0 [2];
  uint local_3b8 [2];
  uint auStack_3b0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  uint auStack_380 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  uint local_358 [2];
  undefined8 uStack_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined8 local_338;
  undefined8 uStack_330;
  uint local_328 [2];
  undefined8 uStack_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  element_type *local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_300;
  uint local_2f8 [2];
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  uint local_2c8 [2];
  undefined8 uStack_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  element_type *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  uint local_298 [2];
  undefined8 uStack_290;
  undefined8 local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  undefined1 local_180 [40];
  int local_158;
  bool local_154;
  double local_150;
  undefined1 local_148 [40];
  int local_120;
  bool local_11c;
  double local_118;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar32 = (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  iVar17 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  lVar30 = (long)iVar17;
  local_460 = 0;
  if (0 < iVar17) {
    local_460 = iVar17;
  }
  local_458 = (bool *)0x0;
  local_450 = 0x3ff3333333333333;
  local_45c = 1;
  if (0 < lVar30) {
    local_45c = local_460;
  }
  local_478 = again;
  spx_alloc<bool*>(&local_458,local_45c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_550,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_568,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_580,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_598,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  lVar31 = (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  local_6b0 = lp;
  local_668 = this;
  local_470 = lVar32;
  local_468 = lVar30;
  if (lVar31 < 1) {
    local_60c = 0;
    local_65c = 0;
  }
  else {
    local_658 = *(double *)(in_FS_OFFSET + -8);
    uStack_650 = 0;
    local_608 = -local_658;
    uStack_600 = 0x8000000000000000;
    local_5f8 = (Item *)&this->m_hist;
    local_65c = 0;
    local_60c = 0;
    lVar30 = lVar31 * 0x38;
    do {
      pnVar19 = (local_6b0->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_6b8 = 2.12199579096527e-313;
      local_6e8 = (undefined1  [8])0x0;
      _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6d8[0] = 0;
      local_6d8[1] = 0;
      stack0xfffffffffffff930 = 0;
      uStack_6cb = 0;
      _local_6c8 = 0;
      uStack_6c3 = 0;
      local_6c0 = 0;
      local_6bc = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
      if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar30 + 8U) == 2) ||
          (local_6b8._0_4_ == cpp_dec_float_NaN)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                              (cpp_dec_float<50U,_int,_void> *)local_6e8), 0 < iVar17)) {
LAB_002e60e6:
        pnVar19 = (local_6b0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_678._0_4_ = cpp_dec_float_finite;
        local_678._4_4_ = 10;
        local_6a8._0_8_ = (element_type *)0x0;
        local_6a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_698[0] = 0;
        local_698[1] = 0;
        stack0xfffffffffffff970 = 0;
        uStack_68b = 0;
        _local_688 = 0;
        uStack_683 = 0;
        local_680 = 0;
        local_67c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
        if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar30 + 8U) == 2) ||
            ((fpclass_type)local_678 == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                (cpp_dec_float<50U,_int,_void> *)local_6a8), 0 < iVar17)) {
          ::soplex::infinity::__tls_init();
          local_6b8 = 2.12199579096527e-313;
          _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_6d8[0] = 0;
          local_6d8[1] = 0;
          stack0xfffffffffffff930 = 0;
          uStack_6cb = 0;
          _local_6c8 = 0;
          uStack_6c3 = 0;
          local_6c0 = 0;
          local_6bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
        }
        else {
          local_6b8 = 2.12199579096527e-313;
          _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_6d8[0] = 0;
          local_6d8[1] = 0;
          stack0xfffffffffffff930 = 0;
          uStack_6cb = 0;
          _local_6c8 = 0;
          uStack_6c3 = 0;
          local_6c0 = 0;
          local_6bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6e8,0.0);
        }
        *(ulong *)((long)local_550.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                  lVar30 + 0x20) = CONCAT35(uStack_6c3,_local_6c8);
        puVar1 = (uint *)((long)local_550.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar30 + 0x10);
        *(undefined8 *)puVar1 = local_6d8._0_8_;
        *(ulong *)(puVar1 + 2) = CONCAT35(uStack_6cb,stack0xfffffffffffff930);
        puVar1 = (uint *)((long)local_550.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar30);
        *(undefined1 (*) [8])puVar1 = local_6e8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2) = _Stack_6e0._M_pi;
        *(int *)((long)(&local_550.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar30)
             = local_6c0;
        *(bool *)((long)(&local_550.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                 lVar30 + 4) = local_6bc;
        *(double *)
         ((long)(&local_550.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar30 + 8) =
             local_6b8;
        pnVar19 = (local_6b0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_678 = 2.12199579096527e-313;
        local_6a8 = ZEXT816(0);
        local_698[0] = 0;
        local_698[1] = 0;
        stack0xfffffffffffff970 = 0;
        uStack_68b = 0;
        _local_688 = 0;
        uStack_683 = 0;
        local_680 = 0;
        local_67c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6a8,local_658);
        if ((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar30 + 8U) == 2) ||
           ((fpclass_type)local_678 == cpp_dec_float_NaN)) {
LAB_002e625e:
          ::soplex::infinity::__tls_init();
          dVar26 = local_658;
        }
        else {
          iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                              (cpp_dec_float<50U,_int,_void> *)local_6a8);
          dVar26 = 0.0;
          if (iVar17 < 0) goto LAB_002e625e;
        }
        local_6b8 = 2.12199579096527e-313;
        _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_6d8[0] = 0;
        local_6d8[1] = 0;
        stack0xfffffffffffff930 = 0;
        uStack_6cb = 0;
        _local_6c8 = 0;
        uStack_6c3 = 0;
        local_6c0 = 0;
        local_6bc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6e8,dVar26);
        *(ulong *)((long)local_568.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                  lVar30 + 0x20) = CONCAT35(uStack_6c3,_local_6c8);
        puVar1 = (uint *)((long)local_568.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar30 + 0x10);
        *(undefined8 *)puVar1 = local_6d8._0_8_;
        *(ulong *)(puVar1 + 2) = CONCAT35(uStack_6cb,stack0xfffffffffffff930);
        puVar1 = (uint *)((long)local_568.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar30);
        *(undefined1 (*) [8])puVar1 = local_6e8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2) = _Stack_6e0._M_pi;
        *(int *)((long)(&local_568.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar30)
             = local_6c0;
        *(bool *)((long)(&local_568.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                 lVar30 + 4) = local_6bc;
        *(double *)
         ((long)(&local_568.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar30 + 8) =
             local_6b8;
      }
      else {
        pnVar19 = (local_6b0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_678 = 2.12199579096527e-313;
        local_6a8._0_8_ = (element_type *)0x0;
        local_6a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_698[0] = 0;
        local_698[1] = 0;
        stack0xfffffffffffff970 = 0;
        uStack_68b = 0;
        _local_688 = 0;
        uStack_683 = 0;
        local_680 = 0;
        local_67c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6a8,local_658);
        if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar30 + 8U) == 2) ||
            ((fpclass_type)local_678 == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                (cpp_dec_float<50U,_int,_void> *)local_6a8), iVar17 < 0))
        goto LAB_002e60e6;
        this_00 = (FreeConstraintPS *)operator_new(0x88);
        local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_668->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_668->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FreeConstraintPS::FreeConstraintPS(this_00,local_6b0,(int)lVar31 + -1,&local_4f8);
        local_6e8 = (undefined1  [8])this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6e8 + 8),this_00);
        if (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back((vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                     *)local_5f8,(value_type *)local_6e8);
        pSVar29 = local_668;
        iVar17 = (local_6b0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(local_6b0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar31 + -1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        piVar12 = (local_668->m_rIdx).data;
        piVar12[lVar31 + -1] =
             piVar12[(long)(local_6b0->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum + -1];
        (*(local_6b0->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0xf])(local_6b0,(ulong)((int)lVar31 - 1));
        piVar12 = (pSVar29->m_stat).data + 1;
        *piVar12 = *piVar12 + 1;
        if (_Stack_6e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_6e0._M_pi);
        }
        local_65c = local_65c + 1;
        local_60c = local_60c + iVar17;
      }
      bVar13 = 1 < lVar31;
      lVar31 = lVar31 + -1;
      lVar30 = lVar30 + -0x38;
    } while (bVar13);
  }
  pSVar27 = local_6b0;
  if (0 < (local_6b0->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_658 = *(double *)(in_FS_OFFSET + -8);
    uStack_650 = 0;
    local_608 = -local_658;
    uStack_600 = 0x8000000000000000;
    lVar32 = 0;
    lVar30 = 0;
    do {
      pIVar24 = (pSVar27->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar8 = (pSVar27->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      iVar17 = pDVar8[lVar30].idx;
      if (pIVar24[iVar17].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 1) {
        iVar17 = (pIVar24[iVar17].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem)->idx;
        pNVar9 = pIVar24[pDVar8[lVar30].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        uVar10 = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 8);
        _local_688 = (undefined5)uVar10;
        uStack_683 = (undefined3)((ulong)uVar10 >> 0x28);
        local_6a8 = *(undefined1 (*) [16])&(pNVar9->val).m_backend.data;
        local_698._0_8_ = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 6);
        stack0xfffffffffffff970 = (undefined5)uVar10;
        uStack_68b = (undefined3)((ulong)uVar10 >> 0x28);
        local_680 = (pNVar9->val).m_backend.exp;
        local_67c = (pNVar9->val).m_backend.neg;
        local_678 = *(double *)&(pNVar9->val).m_backend.fpclass;
        local_618 = 2.12199579096527e-313;
        local_648 = (undefined1  [16])0x0;
        local_638[0] = 0;
        local_638[1] = 0;
        stack0xfffffffffffff9d0 = 0;
        uStack_62b = 0;
        local_628 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x0;
        local_620 = 0;
        local_61c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_648,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((pSVar27->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar32),(cpp_dec_float<50U,_int,_void> *)local_6a8);
        if ((fpclass_type)local_678 != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_6e8,0,(type *)0x0);
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                              (cpp_dec_float<50U,_int,_void> *)local_6e8);
          if (0 < iVar18) {
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            local_6e8 = (undefined1  [8])0x0;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
            if (((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar32 + 8U) != 2) &&
                (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
               (((iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pnVar19->m_backend).data._M_elems + lVar32),
                                      (cpp_dec_float<50U,_int,_void> *)local_6e8), iVar18 < 1 &&
                 (((fpclass_type)local_618 != cpp_dec_float_NaN &&
                  (local_568.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                   cpp_dec_float_NaN)))) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)local_648,
                                     &local_568.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
                iVar18 < 0)))) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_568.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_628;
              puVar1 = local_568.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar1 = local_638._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_62b,stack0xfffffffffffff9d0);
              *(undefined8 *)
               local_568.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_648._0_8_;
              *(undefined8 *)
               (local_568.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_648._8_8_;
              local_568.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_620;
              local_568.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_61c;
              *(double *)
               &local_568.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_618;
            }
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
            pSVar27 = local_6b0;
            if ((((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar32 + 8U) != 2) &&
                 (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     ((long)(pnVar19->m_backend).data._M_elems + lVar32),
                                     (cpp_dec_float<50U,_int,_void> *)local_6e8),
                pSVar27 = local_6b0, -1 < iVar18)) &&
               ((((fpclass_type)local_618 != cpp_dec_float_NaN &&
                 (local_550.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                  cpp_dec_float_NaN)) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)local_648,
                                     &local_550.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
                pSVar27 = local_6b0, 0 < iVar18)))) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_550.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_628;
              puVar1 = local_550.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar1 = local_638._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_62b,stack0xfffffffffffff9d0);
              *(undefined8 *)
               local_550.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_648._0_8_;
              *(undefined8 *)
               (local_550.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_648._8_8_;
              local_550.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_620;
              local_550.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_61c;
              *(double *)
               &local_550.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_618;
            }
            goto LAB_002e693a;
          }
        }
        pSVar27 = local_6b0;
        if ((fpclass_type)local_678 != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_6e8,0,(type *)0x0);
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                              (cpp_dec_float<50U,_int,_void> *)local_6e8);
          pSVar27 = local_6b0;
          if (iVar18 < 0) {
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            local_6e8 = (undefined1  [8])0x0;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
            if (((((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar32 + 8U) != 2) &&
                  (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
                 (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pnVar19->m_backend).data._M_elems + lVar32),
                                      (cpp_dec_float<50U,_int,_void> *)local_6e8), iVar18 < 1)) &&
                (((fpclass_type)local_618 != cpp_dec_float_NaN &&
                 (local_550.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                  cpp_dec_float_NaN)))) &&
               (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_648,
                                    &local_550.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
               0 < iVar18)) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_550.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_628;
              puVar1 = local_550.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar1 = local_638._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_62b,stack0xfffffffffffff9d0);
              *(undefined8 *)
               local_550.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_648._0_8_;
              *(undefined8 *)
               (local_550.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_648._8_8_;
              local_550.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_620;
              local_550.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_61c;
              *(double *)
               &local_550.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_618;
            }
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
            pSVar27 = local_6b0;
            if (((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar32 + 8U) != 2) &&
                (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
               ((iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     ((long)(pnVar19->m_backend).data._M_elems + lVar32),
                                     (cpp_dec_float<50U,_int,_void> *)local_6e8),
                pSVar27 = local_6b0, -1 < iVar18 &&
                ((((fpclass_type)local_618 != cpp_dec_float_NaN &&
                  (local_568.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                   cpp_dec_float_NaN)) &&
                 (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)local_648,
                                      &local_568.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
                 pSVar27 = local_6b0, iVar18 < 0)))))) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_568.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_628;
              puVar1 = local_568.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar1 = local_638._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_62b,stack0xfffffffffffff9d0);
              *(undefined8 *)
               local_568.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_648._0_8_;
              *(undefined8 *)
               (local_568.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_648._8_8_;
              local_568.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_620;
              local_568.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_61c;
              *(double *)
               &local_568.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_618;
            }
          }
        }
      }
LAB_002e693a:
      lVar30 = lVar30 + 1;
      lVar32 = lVar32 + 0x38;
    } while (lVar30 < (pSVar27->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  uVar23 = (pSVar27->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (0 < (int)uVar23) {
    local_658 = *(double *)(in_FS_OFFSET + -8);
    uStack_650 = 0;
    local_608 = -local_658;
    uStack_600 = 0x8000000000000000;
    dVar26 = 0.0;
    do {
      this_01 = (cpp_dec_float<50u,int,void> *)
                (local_598.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)dVar26);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_01,0.0);
      *(undefined8 *)
       (local_580.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems + 8) =
           *(undefined8 *)(this_01 + 0x20);
      uVar10 = *(undefined8 *)this_01;
      uVar14 = *(undefined8 *)(this_01 + 8);
      uVar15 = *(undefined8 *)(this_01 + 0x18);
      puVar1 = local_580.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = *(undefined8 *)(this_01 + 0x10);
      *(undefined8 *)(puVar1 + 2) = uVar15;
      *(undefined8 *)
       local_580.val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems = uVar10;
      *(undefined8 *)
       (local_580.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems + 2) =
           uVar14;
      local_580.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.exp =
           *(int *)(this_01 + 0x28);
      local_580.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.neg = (bool)this_01[0x2c];
      uVar10 = *(undefined8 *)(this_01 + 0x30);
      local_580.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.fpclass = (int)uVar10;
      local_580.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.prec_elem =
           (int)((ulong)uVar10 >> 0x20);
      pIVar24 = (pSVar27->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      iVar17 = (pSVar27->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[(long)dVar26].idx;
      local_5e8 = dVar26;
      if (0 < pIVar24[iVar17].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar24 = pIVar24 + iVar17;
        lVar32 = 0;
        lVar30 = 0;
        local_5f8 = pIVar24;
        do {
          pcVar28 = &local_580.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend;
          ::soplex::infinity::__tls_init();
          local_6b8 = 2.12199579096527e-313;
          local_6e8 = (undefined1  [8])0x0;
          _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6d8[0] = 0;
          local_6d8[1] = 0;
          stack0xfffffffffffff930 = 0;
          uStack_6cb = 0;
          _local_6c8 = 0;
          uStack_6c3 = 0;
          local_6c0 = 0;
          local_6bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
          if (((pcVar28->fpclass != cpp_dec_float_NaN) && (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6e8), iVar17 < 1))
          {
            pcVar28 = &local_598.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend;
            ::soplex::infinity::__tls_init();
            local_678 = 2.12199579096527e-313;
            local_6a8._0_8_ = (element_type *)0x0;
            local_6a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_698[0] = 0;
            local_698[1] = 0;
            stack0xfffffffffffff970 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,local_658);
            if (((pcVar28->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_678 != cpp_dec_float_NaN)) &&
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6a8), -1 < iVar17
               )) break;
          }
          pNVar9 = (pIVar24->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          uVar10 = *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar32 + 0x20);
          _local_688 = (undefined5)uVar10;
          uStack_683 = (undefined3)((ulong)uVar10 >> 0x28);
          local_6a8 = *(undefined1 (*) [16])((long)(pNVar9->val).m_backend.data._M_elems + lVar32);
          puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar32 + 0x10);
          local_698._0_8_ = *(undefined8 *)puVar1;
          uVar10 = *(undefined8 *)(puVar1 + 2);
          stack0xfffffffffffff970 = (undefined5)uVar10;
          uStack_68b = (undefined3)((ulong)uVar10 >> 0x28);
          local_680 = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32);
          local_67c = *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32 + 4);
          local_678 = *(double *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32 + 8);
          iVar17 = *(int *)((long)(&((pIVar24->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar32);
          if (SUB84(local_678,0) == 2) {
LAB_002e6e90:
            if ((fpclass_type)local_678 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_6e8,0,(type *)0x0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                  (cpp_dec_float<50U,_int,_void> *)local_6e8);
              if (iVar18 < 0) {
                pcVar28 = &local_550.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
                ::soplex::infinity::__tls_init();
                local_6b8 = 2.12199579096527e-313;
                local_6e8 = (undefined1  [8])0x0;
                _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_6d8[0] = 0;
                local_6d8[1] = 0;
                stack0xfffffffffffff930 = 0;
                uStack_6cb = 0;
                _local_6c8 = 0;
                uStack_6c3 = 0;
                local_6c0 = 0;
                local_6bc = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
                if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                    (local_6b8._0_4_ == cpp_dec_float_NaN)) ||
                   (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6e8),
                   0 < iVar18)) {
                  local_6b8 = 2.12199579096527e-313;
                  _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                )ZEXT816(0);
                  local_6d8[0] = 0;
                  local_6d8[1] = 0;
                  stack0xfffffffffffff930 = 0;
                  uStack_6cb = 0;
                  _local_6c8 = 0;
                  uStack_6c3 = 0;
                  local_6c0 = 0;
                  local_6bc = false;
                  pcVar28 = (cpp_dec_float<50U,_int,_void> *)local_6a8;
                  if ((cpp_dec_float<50U,_int,_void> *)local_6e8 !=
                      &local_550.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend) {
                    _local_6c8 = _local_688;
                    uStack_6c3 = uStack_683;
                    local_6d8[0] = local_698[0];
                    local_6d8[1] = local_698[1];
                    stack0xfffffffffffff930 = stack0xfffffffffffff970;
                    uStack_6cb = uStack_68b;
                    local_6e8 = (undefined1  [8])local_6a8._0_8_;
                    _Stack_6e0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
                    local_6c0 = local_680;
                    local_6bc = local_67c;
                    local_6b8 = local_678;
                    pcVar28 = &local_550.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            ((cpp_dec_float<50U,_int,_void> *)local_6e8,pcVar28);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_598.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend,
                             (cpp_dec_float<50U,_int,_void> *)local_6e8);
                }
                else {
                  ::soplex::infinity::__tls_init();
                  local_6b8 = 2.12199579096527e-313;
                  _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                )ZEXT816(0);
                  local_6d8[0] = 0;
                  local_6d8[1] = 0;
                  stack0xfffffffffffff930 = 0;
                  uStack_6cb = 0;
                  _local_6c8 = 0;
                  uStack_6c3 = 0;
                  local_6c0 = 0;
                  local_6bc = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
                  *(ulong *)(local_598.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data.
                             _M_elems + 8) = CONCAT35(uStack_6c3,_local_6c8);
                  puVar1 = local_598.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data.
                           _M_elems + 4;
                  *(undefined8 *)puVar1 = local_6d8._0_8_;
                  *(ulong *)(puVar1 + 2) = CONCAT35(uStack_6cb,stack0xfffffffffffff930);
                  *(undefined1 (*) [8])
                   local_598.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems =
                       local_6e8;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   (local_598.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems
                   + 2) = _Stack_6e0._M_pi;
                  local_598.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.exp = local_6c0;
                  local_598.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.neg = local_6bc;
                  *(double *)
                   &local_598.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.fpclass =
                       local_6b8;
                }
                pcVar28 = &local_568.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
                ::soplex::infinity::__tls_init();
                local_6b8 = 2.12199579096527e-313;
                _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              )ZEXT816(0);
                local_6d8[0] = 0;
                local_6d8[1] = 0;
                stack0xfffffffffffff930 = 0;
                uStack_6cb = 0;
                _local_6c8 = 0;
                uStack_6c3 = 0;
                local_6c0 = 0;
                local_6bc = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
                if (((pcVar28->fpclass != cpp_dec_float_NaN) &&
                    (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
                   (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6e8),
                   pIVar24 = local_5f8, -1 < iVar18)) {
                  ::soplex::infinity::__tls_init();
                  local_6b8 = 2.12199579096527e-313;
                  local_6e8 = (undefined1  [8])0x0;
                  _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_6d8[0] = 0;
                  local_6d8[1] = 0;
                  stack0xfffffffffffff930 = 0;
                  uStack_6cb = 0;
                  _local_6c8 = 0;
                  uStack_6c3 = 0;
                  local_6c0 = 0;
                  local_6bc = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
                  pnVar19 = local_580.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  goto LAB_002e7084;
                }
                local_6b8 = 2.12199579096527e-313;
                local_6e8 = (undefined1  [8])0x0;
                _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_6d8[0] = 0;
                local_6d8[1] = 0;
                stack0xfffffffffffff930 = 0;
                uStack_6cb = 0;
                _local_6c8 = 0;
                uStack_6c3 = 0;
                local_6c0 = 0;
                local_6bc = false;
                pcVar28 = (cpp_dec_float<50U,_int,_void> *)local_6a8;
                if ((cpp_dec_float<50U,_int,_void> *)local_6e8 !=
                    &local_568.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend) {
                  _local_6c8 = _local_688;
                  uStack_6c3 = uStack_683;
                  local_6d8[0] = local_698[0];
                  local_6d8[1] = local_698[1];
                  stack0xfffffffffffff930 = stack0xfffffffffffff970;
                  uStack_6cb = uStack_68b;
                  local_6e8 = (undefined1  [8])local_6a8._0_8_;
                  _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_
                  ;
                  local_6c0 = local_680;
                  local_6bc = local_67c;
                  local_6b8 = local_678;
                  pcVar28 = &local_568.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)local_6e8,pcVar28);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_580.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)local_6e8);
                pIVar24 = local_5f8;
              }
            }
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_6e8,0,(type *)0x0);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                (cpp_dec_float<50U,_int,_void> *)local_6e8);
            if (iVar18 < 1) goto LAB_002e6e90;
            pcVar28 = &local_550.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            local_6e8 = (undefined1  [8])0x0;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
            if (((pcVar28->fpclass == cpp_dec_float_NaN) || (local_6b8._0_4_ == cpp_dec_float_NaN))
               || (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6e8),
                  0 < iVar18)) {
              local_6b8 = 2.12199579096527e-313;
              _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            )ZEXT816(0);
              local_6d8[0] = 0;
              local_6d8[1] = 0;
              stack0xfffffffffffff930 = 0;
              uStack_6cb = 0;
              _local_6c8 = 0;
              uStack_6c3 = 0;
              local_6c0 = 0;
              local_6bc = false;
              pcVar28 = (cpp_dec_float<50U,_int,_void> *)local_6a8;
              if ((cpp_dec_float<50U,_int,_void> *)local_6e8 !=
                  &local_550.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend) {
                _local_6c8 = _local_688;
                uStack_6c3 = uStack_683;
                local_6d8[0] = local_698[0];
                local_6d8[1] = local_698[1];
                stack0xfffffffffffff930 = stack0xfffffffffffff970;
                uStack_6cb = uStack_68b;
                local_6e8 = (undefined1  [8])local_6a8._0_8_;
                _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
                local_6c0 = local_680;
                local_6bc = local_67c;
                local_6b8 = local_678;
                pcVar28 = &local_550.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        ((cpp_dec_float<50U,_int,_void> *)local_6e8,pcVar28);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_580.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)local_6e8);
            }
            else {
              ::soplex::infinity::__tls_init();
              local_6b8 = 2.12199579096527e-313;
              _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            )ZEXT816(0);
              local_6d8[0] = 0;
              local_6d8[1] = 0;
              stack0xfffffffffffff930 = 0;
              uStack_6cb = 0;
              _local_6c8 = 0;
              uStack_6c3 = 0;
              local_6c0 = 0;
              local_6bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6e8,local_608);
              *(ulong *)(local_580.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data.
                         _M_elems + 8) = CONCAT35(uStack_6c3,_local_6c8);
              puVar1 = local_580.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data.
                       _M_elems + 4;
              *(undefined8 *)puVar1 = local_6d8._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_6cb,stack0xfffffffffffff930);
              *(undefined1 (*) [8])
               local_580.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems =
                   local_6e8;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               (local_580.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.data._M_elems + 2)
                   = _Stack_6e0._M_pi;
              local_580.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.exp = local_6c0;
              local_580.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.neg = local_6bc;
              *(double *)
               &local_580.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend.fpclass =
                   local_6b8;
            }
            pcVar28 = &local_568.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            _local_6e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
            if (((pcVar28->fpclass == cpp_dec_float_NaN) || (local_6b8._0_4_ == cpp_dec_float_NaN))
               || (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (pcVar28,(cpp_dec_float<50U,_int,_void> *)local_6e8),
                  pIVar24 = local_5f8, iVar18 < 0)) {
              local_6b8 = 2.12199579096527e-313;
              local_6e8 = (undefined1  [8])0x0;
              _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_6d8[0] = 0;
              local_6d8[1] = 0;
              stack0xfffffffffffff930 = 0;
              uStack_6cb = 0;
              _local_6c8 = 0;
              uStack_6c3 = 0;
              local_6c0 = 0;
              local_6bc = false;
              pcVar28 = (cpp_dec_float<50U,_int,_void> *)local_6a8;
              if ((cpp_dec_float<50U,_int,_void> *)local_6e8 !=
                  &local_568.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend) {
                _local_6c8 = _local_688;
                uStack_6c3 = uStack_683;
                local_6d8[0] = local_698[0];
                local_6d8[1] = local_698[1];
                stack0xfffffffffffff930 = stack0xfffffffffffff970;
                uStack_6cb = uStack_68b;
                local_6e8 = (undefined1  [8])local_6a8._0_8_;
                _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
                local_6c0 = local_680;
                local_6bc = local_67c;
                local_6b8 = local_678;
                pcVar28 = &local_568.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        ((cpp_dec_float<50U,_int,_void> *)local_6e8,pcVar28);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_598.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)local_6e8);
              pIVar24 = local_5f8;
            }
            else {
              ::soplex::infinity::__tls_init();
              local_6b8 = 2.12199579096527e-313;
              local_6e8 = (undefined1  [8])0x0;
              _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_6d8[0] = 0;
              local_6d8[1] = 0;
              stack0xfffffffffffff930 = 0;
              uStack_6cb = 0;
              _local_6c8 = 0;
              uStack_6c3 = 0;
              local_6c0 = 0;
              local_6bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6e8,local_658);
              pnVar19 = local_598.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_002e7084:
              *(ulong *)(pnVar19[(long)dVar26].m_backend.data._M_elems + 8) =
                   CONCAT35(uStack_6c3,_local_6c8);
              puVar1 = pnVar19[(long)dVar26].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = local_6d8._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_6cb,stack0xfffffffffffff930);
              *(undefined1 (*) [8])pnVar19[(long)dVar26].m_backend.data._M_elems = local_6e8;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               (pnVar19[(long)dVar26].m_backend.data._M_elems + 2) = _Stack_6e0._M_pi;
              pnVar19[(long)dVar26].m_backend.exp = local_6c0;
              pnVar19[(long)dVar26].m_backend.neg = local_6bc;
              *(double *)&pnVar19[(long)dVar26].m_backend.fpclass = local_6b8;
            }
          }
          lVar30 = lVar30 + 1;
          lVar32 = lVar32 + 0x3c;
        } while (lVar30 < (pIVar24->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      dVar26 = (double)((long)local_5e8 + 1);
      uVar23 = (local_6b0->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      pSVar27 = local_6b0;
    } while ((long)dVar26 < (long)(int)uVar23);
  }
  RVar22 = UNBOUNDED;
  local_5f8 = (Item *)CONCAT71(local_5f8._1_7_,(int)uVar23 < 1);
  pSVar29 = local_668;
  iVar17 = local_65c;
  if ((int)uVar23 < 1) {
    local_5ec = 0;
  }
  else {
    local_438 = *(double *)(in_FS_OFFSET + -8);
    local_5a0 = &local_668->m_hist;
    uStack_430 = 0;
    local_448 = -local_438;
    uStack_440 = 0x8000000000000000;
    lVar30 = (ulong)uVar23 * 0x38;
    local_5ec = 0;
    dVar26 = (double)((ulong)uVar23 + 1);
    do {
      if (1 < (local_6b0->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(local_6b0->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[(long)dVar26 - 2].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        puVar2 = (undefined8 *)
                 ((long)local_598.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar30);
        local_2a8 = (element_type *)*puVar2;
        _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
        puVar1 = (uint *)((long)(&((local_598.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + -1
                                ) + lVar30);
        local_298 = *(uint (*) [2])puVar1;
        uStack_290 = *(undefined8 *)(puVar1 + 2);
        local_288 = *(undefined8 *)
                     ((long)((local_598.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar30 + -0x18);
        iVar17 = *(int *)((long)((local_598.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0x10);
        cVar3 = *(char *)((long)((local_598.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0xc);
        local_608 = *(double *)
                     ((long)((local_598.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar30 + -8);
        uStack_600 = 0;
        pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)((long)((local_580.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar30 + -0x18);
        puVar2 = (undefined8 *)
                 ((long)local_580.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar30);
        local_2d8 = *puVar2;
        uStack_2d0 = puVar2[1];
        puVar1 = (uint *)((long)(&((local_580.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + -1
                                ) + lVar30);
        local_2c8 = *(uint (*) [2])puVar1;
        uStack_2c0 = *(undefined8 *)(puVar1 + 2);
        iVar18 = *(int *)((long)((local_580.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0x10);
        cVar4 = *(char *)((long)((local_580.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0xc);
        local_5e8 = *(double *)
                     ((long)((local_580.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar30 + -8);
        uStack_5e0 = 0;
        local_658 = dVar26;
        local_2b8 = pnVar21;
        opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_148,pSVar29);
        local_6a8._8_8_ = _Stack_2a0._M_pi;
        local_6a8._0_8_ = local_2a8;
        local_698[0] = local_298[0];
        local_698[1] = local_298[1];
        stack0xfffffffffffff970 = (undefined5)uStack_290;
        uStack_68b = (undefined3)((ulong)uStack_290 >> 0x28);
        _local_688 = (undefined5)local_288;
        uStack_683 = (undefined3)((ulong)local_288 >> 0x28);
        local_678 = local_608;
        local_648._8_8_ = uStack_2d0;
        local_648._0_8_ = local_2d8;
        local_638[0] = local_2c8[0];
        local_638[1] = local_2c8[1];
        stack0xfffffffffffff9d0 = (undefined5)uStack_2c0;
        uStack_62b = (undefined3)((ulong)uStack_2c0 >> 0x28);
        local_628 = local_2b8;
        local_618 = local_5e8;
        local_680 = iVar17;
        local_67c = (bool)cVar3;
        local_620 = iVar18;
        local_61c = (bool)cVar4;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6e8,(soplex *)local_6a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_648,pnVar21);
        local_5d8._0_8_ = local_148._0_8_;
        uVar10 = local_5d8._0_8_;
        local_5d8._8_8_ = local_148._8_8_;
        local_5d8._32_8_ = local_148._32_8_;
        local_5d8._16_8_ = local_148._16_8_;
        local_5d8._24_8_ = local_148._24_8_;
        local_5b0 = local_120;
        local_5ac = local_11c;
        local_5a8 = local_118;
        local_5d8._0_4_ = (undefined4)local_148._0_8_;
        if (local_5d8._0_4_ != 0 || SUB84(local_118,0) != 0) {
          local_5ac = (bool)(local_11c ^ 1);
        }
        local_5d8._0_8_ = uVar10;
        if (((SUB84(local_118,0) != 2) && (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6e8,
                                (cpp_dec_float<50U,_int,_void> *)local_5d8), iVar17 < 1)) {
          RVar22 = DUAL_INFEASIBLE;
          iVar17 = local_65c;
          goto LAB_002e87ee;
        }
        pnVar19 = (local_6b0->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_4c8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
        puVar2 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
        local_4e8 = (element_type *)*puVar2;
        _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
        puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
        local_4d8 = *(uint (*) [2])puVar1;
        uStack_4d0 = *(undefined8 *)(puVar1 + 2);
        local_608 = (double)CONCAT44(local_608._4_4_,
                                     *(undefined4 *)
                                      ((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10));
        cVar3 = *(char *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
        uVar6 = *(undefined4 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
        uVar7 = *(undefined4 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -4);
        local_2e8 = *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
        puVar2 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
        local_308 = (element_type *)*puVar2;
        _Stack_300._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
        puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
        local_2f8 = *(uint (*) [2])puVar1;
        uStack_2f0 = *(undefined8 *)(puVar1 + 2);
        pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)((long)((local_598.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar30 + -0x18);
        puVar2 = (undefined8 *)
                 ((long)local_598.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar30);
        local_338 = *puVar2;
        uStack_330 = puVar2[1];
        puVar1 = (uint *)((long)(&((local_598.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + -1
                                ) + lVar30);
        local_328 = *(uint (*) [2])puVar1;
        uStack_320 = *(undefined8 *)(puVar1 + 2);
        iVar17 = *(int *)((long)((local_598.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0x10);
        cVar4 = *(char *)((long)((local_598.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0xc);
        local_5e8 = *(double *)
                     ((long)((local_598.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar30 + -8);
        uStack_5e0 = 0;
        local_318 = pnVar21;
        opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,pSVar29);
        local_6a8._8_8_ = _Stack_300._M_pi;
        local_6a8._0_8_ = local_308;
        local_698[0] = local_2f8[0];
        local_698[1] = local_2f8[1];
        stack0xfffffffffffff970 = (undefined5)uStack_2f0;
        uStack_68b = (undefined3)((ulong)uStack_2f0 >> 0x28);
        _local_688 = (undefined5)local_2e8;
        uStack_683 = (undefined3)((ulong)local_2e8 >> 0x28);
        local_680 = local_608._0_4_;
        local_678 = (double)CONCAT44(uVar7,uVar6);
        local_648._8_8_ = uStack_330;
        local_648._0_8_ = local_338;
        local_638[0] = local_328[0];
        local_638[1] = local_328[1];
        stack0xfffffffffffff9d0 = (undefined5)uStack_320;
        uStack_62b = (undefined3)((ulong)uStack_320 >> 0x28);
        local_628 = local_318;
        local_618 = local_5e8;
        local_67c = (bool)cVar3;
        local_620 = iVar17;
        local_61c = (bool)cVar4;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6e8,(soplex *)local_6a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_648,pnVar21);
        if (((local_6b8._0_4_ == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6e8,&local_68), iVar17 < 1))
        {
          puVar2 = (undefined8 *)
                   ((long)local_580.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar30);
          local_368 = *puVar2;
          uStack_360 = puVar2[1];
          puVar1 = (uint *)((long)(&((local_580.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                                  -1) + lVar30);
          local_358 = *(uint (*) [2])puVar1;
          uStack_350 = *(undefined8 *)(puVar1 + 2);
          pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)((local_580.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -0x18);
          iVar17 = *(int *)((long)((local_580.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar30 + -0x10);
          cVar4 = *(char *)((long)((local_580.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar30 + -0xc);
          local_5e8 = *(double *)
                       ((long)((local_580.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar30 + -8);
          uStack_5e0 = 0;
          local_348 = pnVar21;
          opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_180,local_668);
          local_6a8._8_8_ = _Stack_4e0._M_pi;
          local_6a8._0_8_ = local_4e8;
          local_698[0] = local_4d8[0];
          local_698[1] = local_4d8[1];
          stack0xfffffffffffff970 = (undefined5)uStack_4d0;
          uStack_68b = (undefined3)((ulong)uStack_4d0 >> 0x28);
          _local_688 = SUB85(local_4c8,0);
          uStack_683 = (undefined3)((ulong)local_4c8 >> 0x28);
          local_680 = local_608._0_4_;
          local_678 = (double)CONCAT44(uVar7,uVar6);
          local_648._8_8_ = uStack_360;
          local_648._0_8_ = local_368;
          local_638[0] = local_358[0];
          local_638[1] = local_358[1];
          stack0xfffffffffffff9d0 = (undefined5)uStack_350;
          uStack_62b = (undefined3)((ulong)uStack_350 >> 0x28);
          local_628 = local_348;
          local_618 = local_5e8;
          local_67c = (bool)cVar3;
          local_620 = iVar17;
          local_61c = (bool)cVar4;
          relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_6e8,(soplex *)local_6a8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_648,pnVar21);
          local_5d8._0_8_ = local_180._0_8_;
          uVar10 = local_5d8._0_8_;
          local_5d8._8_8_ = local_180._8_8_;
          local_5d8._32_8_ = local_180._32_8_;
          local_5d8._16_8_ = local_180._16_8_;
          local_5d8._24_8_ = local_180._24_8_;
          local_5b0 = local_158;
          local_5ac = local_154;
          local_5a8 = local_150;
          local_5d8._0_4_ = (undefined4)local_180._0_8_;
          if (local_5d8._0_4_ != 0 || SUB84(local_150,0) != 0) {
            local_5ac = (bool)(local_154 ^ 1);
          }
          local_5d8._0_8_ = uVar10;
          if (((SUB84(local_150,0) != 2) && (local_6b8._0_4_ != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_5d8), iVar17 < 1)) {
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6b8 = 2.12199579096527e-313;
            local_6e8 = (undefined1  [8])0x0;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6d8[0] = 0;
            local_6d8[1] = 0;
            stack0xfffffffffffff930 = 0;
            uStack_6cb = 0;
            _local_6c8 = 0;
            uStack_6c3 = 0;
            local_6c0 = 0;
            local_6bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6e8,local_448);
            dVar26 = local_658;
            pSVar29 = local_668;
            if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8) == 2) ||
                (local_6b8._0_4_ == cpp_dec_float_NaN)) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                    (cpp_dec_float<50U,_int,_void> *)local_6e8), 0 < iVar17)) {
              pnVar19 = (local_6b0->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pFVar20 = (FixBoundsPS *)operator_new(0x30);
              local_1f8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
              puVar1 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
              local_1f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_1f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
              local_1f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_1f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_1f8.m_backend.exp =
                   *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
              local_1f8.m_backend.neg =
                   *(bool *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
              local_1f8.m_backend._48_8_ =
                   *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
              local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              FixBoundsPS::FixBoundsPS(pFVar20,local_6b0,SUB84(dVar26,0) + -2,&local_1f8,&local_518)
              ;
              local_6e8 = (undefined1  [8])pFVar20;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6e8 + 8),pFVar20);
              if (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_518.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_5a0->data,(value_type *)local_6e8);
              (*(local_6b0->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x2d])
                        (local_6b0,(ulong)(SUB84(dVar26,0) - 2),
                         (long)(local_6b0->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                         + lVar30,0);
              goto LAB_002e8324;
            }
            pSVar11 = (pSVar29->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
              local_6e8._0_4_ = pSVar11->m_verbosity;
              local_6a8._0_4_ = 4;
              (*pSVar11->_vptr_SPxOut[2])
                        (pSVar11,(__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  *)local_6a8);
              pSVar11 = (pSVar29->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar11->m_streams[pSVar11->m_verbosity]," unbounded",10);
              cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) +
                              cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              pSVar11 = (pSVar29->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6e8);
            }
            goto LAB_002e86ae;
          }
          pnVar19 = (local_6b0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_488._0_4_ = cpp_dec_float_finite;
          local_488._4_4_ = 10;
          local_4b8._0_16_ = (undefined1  [16])0x0;
          local_4b8._16_13_ = SUB1613((undefined1  [16])0x0,0);
          uStack_49b = 0;
          auStack_498 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_4b8,local_438);
          uVar10 = local_6d8._0_8_;
          if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8) != 2) &&
              ((fpclass_type)local_488 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                  (cpp_dec_float<50U,_int,_void> *)local_4b8),
             uVar10 = local_6d8._0_8_, iVar17 < 0)) {
            puVar1 = (uint *)((long)local_598.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar30);
            local_398 = *(uint (*) [2])puVar1;
            auStack_390 = *(uint (*) [2])(puVar1 + 2);
            puVar1 = (uint *)((long)(&((local_598.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                    + -1) + lVar30);
            local_388 = *(uint (*) [2])puVar1;
            auStack_380 = *(uint (*) [2])(puVar1 + 2);
            pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        **)((long)((local_598.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar30 + -0x18);
            iVar17 = *(int *)((long)((local_598.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar30 + -0x10);
            bVar5 = *(byte *)((long)((local_598.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar30 + -0xc);
            local_5e8 = *(double *)
                         ((long)((local_598.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -8);
            uStack_5e0 = 0;
            local_378 = pnVar21;
            opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_a0,local_668);
            local_648._8_8_ = _Stack_4e0._M_pi;
            local_648._0_8_ = local_4e8;
            local_638[0] = local_4d8[0];
            local_638[1] = local_4d8[1];
            stack0xfffffffffffff9d0 = (undefined5)uStack_4d0;
            uStack_62b = (undefined3)((ulong)uStack_4d0 >> 0x28);
            local_628 = local_4c8;
            local_620 = local_608._0_4_;
            local_618 = (double)CONCAT44(uVar7,uVar6);
            local_5d8._0_4_ = local_398[0];
            local_5d8._4_4_ = local_398[1];
            local_5d8._8_4_ = auStack_390[0];
            local_5d8._12_4_ = auStack_390[1];
            local_5d8._16_4_ = local_388[0];
            local_5d8._20_4_ = local_388[1];
            local_5d8._24_4_ = auStack_380[0];
            local_5d8._28_4_ = auStack_380[1];
            local_5d8._32_8_ = local_378;
            local_5a8 = local_5e8;
            local_61c = (bool)cVar3;
            local_5b0 = iVar17;
            local_5ac = (bool)bVar5;
            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6a8,(soplex *)local_648,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_5d8,pnVar21);
            _local_6c8 = _local_688;
            uStack_6c3 = uStack_683;
            uVar10._0_4_ = local_698[0];
            uVar10._4_4_ = local_698[1];
            local_6d8[0] = local_698[0];
            local_6d8[1] = local_698[1];
            stack0xfffffffffffff930 = stack0xfffffffffffff970;
            uStack_6cb = uStack_68b;
            local_6e8 = (undefined1  [8])local_6a8._0_8_;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
            _Var16 = _local_6e8;
            local_6c0 = local_680;
            local_6bc = local_67c;
            local_6b8 = local_678;
            if ((local_67c == true) &&
               (local_6e8._0_4_ = local_6a8._0_4_, local_6e8._0_4_ != 0 || SUB84(local_678,0) != 0))
            {
              local_6bc = false;
            }
            _local_6e8 = _Var16;
            if (((SUB84(local_678,0) == 2) ||
                (uVar10 = local_6d8._0_8_, local_a0.fpclass == cpp_dec_float_NaN)) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_6e8,&local_a0),
               uVar10 = local_6d8._0_8_, 0 < iVar17)) goto LAB_002e7ab4;
            pFVar20 = (FixBoundsPS *)operator_new(0x30);
            pSVar29 = local_668;
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_238.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
            puVar1 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
            local_238.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_238.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
            local_238.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_238.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_238.m_backend.exp =
                 *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
            local_238.m_backend.neg =
                 *(bool *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
            local_238.m_backend._48_8_ =
                 *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
            local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (local_668->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (local_668->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar17 = SUB84(local_658,0);
            FixBoundsPS::FixBoundsPS(pFVar20,local_6b0,iVar17 + -2,&local_238,&local_528);
            local_6e8 = (undefined1  [8])pFVar20;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6e8 + 8),pFVar20);
            if (local_528.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_528.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&local_5a0->data,(value_type *)local_6e8);
            (*(local_6b0->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2a])
                      (local_6b0,(ulong)(iVar17 - 2),
                       (long)(local_6b0->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                       lVar30,0);
LAB_002e87bd:
            piVar12 = (pSVar29->m_stat).data + 0xb;
            *piVar12 = *piVar12 + 1;
            goto LAB_002e832e;
          }
LAB_002e7ab4:
          local_6d8._0_8_ = uVar10;
          pnVar19 = (local_6b0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_488._0_4_ = cpp_dec_float_finite;
          local_488._4_4_ = 10;
          local_4b8._0_16_ = (undefined1  [16])0x0;
          local_4b8._16_13_ = SUB1613((undefined1  [16])0x0,0);
          uStack_49b = 0;
          auStack_498 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_4b8,local_448);
          pSVar29 = local_668;
          _Var16 = _local_6e8;
          if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8) != 2) &&
              ((fpclass_type)local_488 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                  (cpp_dec_float<50U,_int,_void> *)local_4b8), pSVar29 = local_668,
             _Var16 = _local_6e8, 0 < iVar17)) {
            puVar1 = (uint *)((long)local_580.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar30);
            local_3c8 = *(uint (*) [2])puVar1;
            auStack_3c0 = *(uint (*) [2])(puVar1 + 2);
            puVar1 = (uint *)((long)(&((local_580.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                    + -1) + lVar30);
            local_3b8 = *(uint (*) [2])puVar1;
            auStack_3b0 = *(uint (*) [2])(puVar1 + 2);
            pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        **)((long)((local_580.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar30 + -0x18);
            iVar17 = *(int *)((long)((local_580.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar30 + -0x10);
            bVar5 = *(byte *)((long)((local_580.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar30 + -0xc);
            local_5e8 = *(double *)
                         ((long)((local_580.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar30 + -8);
            uStack_5e0 = 0;
            local_3a8 = pnVar21;
            opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_d8,local_668);
            local_648._8_8_ = _Stack_4e0._M_pi;
            local_648._0_8_ = local_4e8;
            local_638[0] = local_4d8[0];
            local_638[1] = local_4d8[1];
            stack0xfffffffffffff9d0 = (undefined5)uStack_4d0;
            uStack_62b = (undefined3)((ulong)uStack_4d0 >> 0x28);
            local_628 = local_4c8;
            local_620 = local_608._0_4_;
            local_618 = (double)CONCAT44(uVar7,uVar6);
            local_5d8._0_4_ = local_3c8[0];
            local_5d8._4_4_ = local_3c8[1];
            local_5d8._8_4_ = auStack_3c0[0];
            local_5d8._12_4_ = auStack_3c0[1];
            local_5d8._16_4_ = local_3b8[0];
            local_5d8._20_4_ = local_3b8[1];
            local_5d8._24_4_ = auStack_3b0[0];
            local_5d8._28_4_ = auStack_3b0[1];
            local_5d8._32_8_ = local_3a8;
            local_5a8 = local_5e8;
            local_61c = (bool)cVar3;
            local_5b0 = iVar17;
            local_5ac = (bool)bVar5;
            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_6a8,(soplex *)local_648,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_5d8,pnVar21);
            _local_6c8 = _local_688;
            uStack_6c3 = uStack_683;
            local_6d8[0] = local_698[0];
            local_6d8[1] = local_698[1];
            stack0xfffffffffffff930 = stack0xfffffffffffff970;
            uStack_6cb = uStack_68b;
            local_6e8 = (undefined1  [8])local_6a8._0_8_;
            _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
            _Var16 = _local_6e8;
            local_6c0 = local_680;
            local_6bc = local_67c;
            local_6b8 = local_678;
            if ((local_67c == true) &&
               (local_6e8._0_4_ = local_6a8._0_4_, local_6e8._0_4_ != 0 || SUB84(local_678,0) != 0))
            {
              local_6bc = false;
            }
            pSVar29 = local_668;
            if (((SUB84(local_678,0) != 2) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
               (_local_6e8 = _Var16,
               iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)local_6e8,&local_d8),
               pSVar29 = local_668, _Var16 = _local_6e8, iVar17 < 1)) {
              pFVar20 = (FixBoundsPS *)operator_new(0x30);
              pnVar19 = (local_6b0->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_278.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
              puVar1 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
              local_278.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_278.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
              local_278.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_278.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_278.m_backend.exp =
                   *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
              local_278.m_backend.neg =
                   *(bool *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
              local_278.m_backend._48_8_ =
                   *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
              local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              iVar17 = SUB84(local_658,0);
              FixBoundsPS::FixBoundsPS(pFVar20,local_6b0,iVar17 + -2,&local_278,&local_538);
              local_6e8 = (undefined1  [8])pFVar20;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6e8 + 8),pFVar20);
              if (local_538.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_538.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_5a0->data,(value_type *)local_6e8);
              (*(local_6b0->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x2d])
                        (local_6b0,(ulong)(iVar17 - 2),
                         (long)(local_6b0->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                         + lVar30,0);
              goto LAB_002e87bd;
            }
          }
LAB_002e833d:
          _local_6e8 = _Var16;
          pnVar19 = (local_6b0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3d8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        **)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
          puVar2 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
          local_3f8 = *puVar2;
          uStack_3f0 = puVar2[1];
          puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
          local_3e8 = *(uint (*) [2])puVar1;
          uStack_3e0 = *(undefined8 *)(puVar1 + 2);
          iVar17 = *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
          cVar3 = *(char *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
          local_608 = *(double *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
          uStack_600 = 0;
          pnVar19 = (local_6b0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar21 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
          puVar1 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
          local_428 = *(uint (*) [2])puVar1;
          auStack_420 = *(uint (*) [2])(puVar1 + 2);
          puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
          local_418 = *(uint (*) [2])puVar1;
          auStack_410 = *(uint (*) [2])(puVar1 + 2);
          iVar18 = *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
          bVar5 = *(byte *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
          local_5e8 = *(double *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
          uStack_5e0 = 0;
          local_408 = pnVar21;
          feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_110,pSVar29);
          local_648._8_8_ = uStack_3f0;
          local_648._0_8_ = local_3f8;
          local_638[0] = local_3e8[0];
          local_638[1] = local_3e8[1];
          stack0xfffffffffffff9d0 = (undefined5)uStack_3e0;
          uStack_62b = (undefined3)((ulong)uStack_3e0 >> 0x28);
          local_628 = local_3d8;
          local_618 = local_608;
          local_5d8._0_4_ = local_428[0];
          local_5d8._4_4_ = local_428[1];
          local_5d8._8_4_ = auStack_420[0];
          local_5d8._12_4_ = auStack_420[1];
          local_5d8._16_4_ = local_418[0];
          local_5d8._20_4_ = local_418[1];
          local_5d8._24_4_ = auStack_410[0];
          local_5d8._28_4_ = auStack_410[1];
          local_5d8._32_8_ = local_408;
          local_5a8 = local_5e8;
          local_620 = iVar17;
          local_61c = (bool)cVar3;
          local_5b0 = iVar18;
          local_5ac = (bool)bVar5;
          relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_6a8,(soplex *)local_648,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_5d8,pnVar21);
          _local_6c8 = _local_688;
          uStack_6c3 = uStack_683;
          local_6d8[0] = local_698[0];
          local_6d8[1] = local_698[1];
          stack0xfffffffffffff930 = stack0xfffffffffffff970;
          uStack_6cb = uStack_68b;
          local_6e8 = (undefined1  [8])local_6a8._0_8_;
          _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
          _Var16 = _local_6e8;
          local_6c0 = local_680;
          local_6bc = local_67c;
          local_6b8 = local_678;
          if ((local_67c == true) &&
             (local_6e8._0_4_ = local_6a8._0_4_, local_6e8._0_4_ != 0 || SUB84(local_678,0) != 0)) {
            local_6bc = false;
          }
          _local_6e8 = _Var16;
          if (((SUB84(local_678,0) != 2) && (local_110.fpclass != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6e8,&local_110), iVar17 < 1
             )) {
            fixColumn(local_668,local_6b0,SUB84(local_658,0) + -2,true);
            iVar17 = (local_6b0->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem
                     [(local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[(long)local_658 - 2].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            piVar12 = (local_668->m_cIdx).data;
            piVar12[(long)local_658 - 2] =
                 piVar12[(long)(local_6b0->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set.thenum + -1];
            (*(local_6b0->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x15])(local_6b0,(ulong)(SUB84(local_658,0) - 2));
            local_5ec = local_5ec + 1;
            local_60c = local_60c + iVar17;
            piVar12 = (local_668->m_stat).data + 5;
            *piVar12 = *piVar12 + 1;
          }
          bVar13 = true;
          dVar26 = local_658;
          pSVar29 = local_668;
        }
        else {
          pnVar19 = (local_6b0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_6b8 = 2.12199579096527e-313;
          local_6e8 = (undefined1  [8])0x0;
          _Stack_6e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6d8[0] = 0;
          local_6d8[1] = 0;
          stack0xfffffffffffff930 = 0;
          uStack_6cb = 0;
          _local_6c8 = 0;
          uStack_6c3 = 0;
          local_6c0 = 0;
          local_6bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6e8,local_438);
          dVar26 = local_658;
          pSVar29 = local_668;
          if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8) == 2) ||
              (local_6b8._0_4_ == cpp_dec_float_NaN)) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar30),
                                  (cpp_dec_float<50U,_int,_void> *)local_6e8), iVar17 < 0)) {
            pnVar19 = (local_6b0->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pFVar20 = (FixBoundsPS *)operator_new(0x30);
            local_1b8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x18);
            puVar1 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar30);
            local_1b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_1b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(&(pnVar19->m_backend).data + -1) + lVar30);
            local_1b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_1b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_1b8.m_backend.exp =
                 *(int *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0x10);
            local_1b8.m_backend.neg =
                 *(bool *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -0xc);
            local_1b8.m_backend._48_8_ =
                 *(undefined8 *)((long)(pnVar19->m_backend).data._M_elems + lVar30 + -8);
            local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pSVar29->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (pSVar29->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            FixBoundsPS::FixBoundsPS(pFVar20,local_6b0,SUB84(dVar26,0) + -2,&local_1b8,&local_508);
            local_6e8 = (undefined1  [8])pFVar20;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6e8 + 8),pFVar20);
            if (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_508.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&local_5a0->data,(value_type *)local_6e8);
            (*(local_6b0->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2a])
                      (local_6b0,(ulong)(SUB84(dVar26,0) - 2),
                       (long)(local_6b0->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                       lVar30,0);
LAB_002e8324:
            piVar12 = (pSVar29->m_stat).data + 10;
            *piVar12 = *piVar12 + 1;
LAB_002e832e:
            _Var16 = _local_6e8;
            if (_Stack_6e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_6e0._M_pi);
              _Var16 = _local_6e8;
            }
            goto LAB_002e833d;
          }
          pSVar11 = (pSVar29->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
            local_6e8._0_4_ = pSVar11->m_verbosity;
            local_6a8._0_4_ = 4;
            (*pSVar11->_vptr_SPxOut[2])
                      (pSVar11,(__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                *)local_6a8);
            pSVar11 = (pSVar29->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar11->m_streams[pSVar11->m_verbosity]," unbounded",10);
            cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) +
                            cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pSVar11 = (pSVar29->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6e8);
          }
LAB_002e86ae:
          bVar13 = false;
        }
        iVar17 = local_65c;
        if (!bVar13) break;
      }
      dVar25 = (double)((long)dVar26 - 1);
      lVar30 = lVar30 + -0x38;
      lVar32 = (long)dVar26 - 3;
      local_5f8 = (Item *)CONCAT71(local_5f8._1_7_,(long)dVar25 < 2);
      dVar26 = dVar25;
    } while (SBORROW8((long)dVar25,2) == lVar32 < 0);
    RVar22 = UNBOUNDED;
  }
LAB_002e87ee:
  if (((ulong)local_5f8 & 1) != 0) {
    uVar23 = local_5ec + iVar17;
    if (uVar23 != 0 && SCARRY4(local_5ec,iVar17) == (int)uVar23 < 0) {
      piVar12 = &(pSVar29->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remRows;
      *piVar12 = *piVar12 + iVar17;
      piVar12 = &(pSVar29->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remCols;
      *piVar12 = *piVar12 + local_5ec;
      piVar12 = &(pSVar29->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remNzos;
      *piVar12 = *piVar12 + local_60c;
      pSVar11 = (pSVar29->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
        local_6e8._0_4_ = pSVar11->m_verbosity;
        local_6a8._0_4_ = 4;
        (*pSVar11->_vptr_SPxOut[2])();
        pSVar11 = (pSVar29->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity],"Simplifier (dual) removed ",0x1a);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],local_5ec);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," cols, ",7);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],local_60c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," non-zeros",10);
        cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pSVar11 = (pSVar29->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6e8);
      }
      local_678 = 2.12199579096527e-313;
      local_6a8._0_8_ = (element_type *)0x0;
      local_6a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_698[0] = 0;
      local_698[1] = 0;
      stack0xfffffffffffff970 = 0;
      uStack_68b = 0;
      _local_688 = 0;
      uStack_683 = 0;
      local_680 = 0;
      local_67c = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_6e8,local_468 + local_470,(type *)0x0);
      pnVar21 = &(pSVar29->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction;
      if ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           *)local_6a8 !=
          (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           *)pnVar21) {
        uVar10 = *(undefined8 *)
                  ((pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 8);
        _local_688 = (undefined5)uVar10;
        uStack_683 = (undefined3)((ulong)uVar10 >> 0x28);
        local_6a8 = *(undefined1 (*) [16])(pnVar21->m_backend).data._M_elems;
        local_698._0_8_ =
             *(undefined8 *)
              ((pSVar29->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)
                  ((pSVar29->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 6);
        stack0xfffffffffffff970 = (undefined5)uVar10;
        uStack_68b = (undefined3)((ulong)uVar10 >> 0x28);
        local_680 = (pSVar29->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend.exp;
        local_67c = (pSVar29->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend.neg;
        local_678 = *(double *)
                     &(pSVar29->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.fpclass;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                 (cpp_dec_float<50U,_int,_void> *)local_6e8);
      if ((fpclass_type)local_678 != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<50U,_int,_void> *)local_6e8,(ulong)uVar23,(type *)0x0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                            (cpp_dec_float<50U,_int,_void> *)local_6e8);
        RVar22 = OKAY;
        if (iVar17 < 0) {
          *local_478 = true;
          RVar22 = OKAY;
        }
        goto LAB_002e8a1a;
      }
    }
    RVar22 = OKAY;
  }
LAB_002e8a1a:
  if (local_598.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_580.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_580.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_580.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_580.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_568.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_568.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_568.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_550.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_550.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_550.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_550.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_458 != (bool *)0x0) {
    free(local_458);
  }
  return RVar22;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplifyDual(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies LP using the following dual structures:
   //
   // 1. dominated columns
   // 2. weakly dominated columns
   //
   // For constructing the dual variables, it is assumed that the objective sense is max

   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   DataArray<bool> colSingleton(lp.nCols());
   VectorBase<R>         dualVarLo(lp.nRows());
   VectorBase<R>         dualVarUp(lp.nRows());
   VectorBase<R>         dualConsLo(lp.nCols());
   VectorBase<R>         dualConsUp(lp.nCols());

   // init
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // check for unconstrained constraints
      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         SPxOut::debug(this, "IMAISM43 row {}: unconstrained\n", i);

         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         remNzos += lp.rowVector(i).size();
         removeRow(lp, i);

         ++m_stat[FREE_ROW];

         continue;
      }

      // corresponds to maximization sense
      dualVarLo[i] = (lp.lhs(i) <= R(-infinity)) ? 0.0 : R(-infinity);
      dualVarUp[i] = (lp.rhs(i) >=  R(infinity)) ? 0.0 :  R(infinity);
   }

   // compute bounds on the dual variables using column singletons
   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(lp.colVector(j).size() == 1)
      {
         int  i   = lp.colVector(j).index(0);
         R aij = lp.colVector(j).value(0);

         SOPLEX_ASSERT_WARN("WMAISM44", isNotZero(aij, R(1.0 / R(infinity))));

         R bound = lp.maxObj(j) / aij;

         if(aij > 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;
         }
         else if(aij < 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;
         }
      }

   }

   // compute bounds on the dual constraints
   for(int j = 0; j < lp.nCols(); ++j)
   {
      dualConsLo[j] = dualConsUp[j] = 0.0;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         if(dualConsLo[j] <= R(-infinity) && dualConsUp[j] >= R(infinity))
            break;

         R aij = col.value(k);
         int  i   = col.index(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(aij > 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarUp[i];
         }
         else if(aij < 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarUp[i];
         }
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      if(lp.colVector(j).size() <= 1)
         continue;

      // dual infeasibility checks
      if(LTrel(dualConsUp[j], dualConsLo[j], opttol()))
      {
         SPxOut::debug(this, "IMAISM46 col {}: dual infeasible -> dual lhs bound={} dual rhs bound={}\n", j,
                       dualConsLo[j], dualConsUp[j]);
         return this->DUAL_INFEASIBLE;
      }

      R obj = lp.maxObj(j);

      // 1. dominated column
      // Is the problem really unbounded in the cases below ??? Or is only dual infeasibility be shown
      if(GTrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM47 col{}: dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         if(lp.upper(j) >= R(infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at upper={}\n", lp.upper(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[DOMINATED_COL];
#endif
      }
      else if(LTrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM48 col {}: dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         if(lp.lower(j) <= R(-infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at lower={}\n", lp.lower(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[DOMINATED_COL];
#endif
      }

      // 2. weakly dominated column (no postsolving)
      else if(lp.upper(j) < R(infinity) && EQrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM49 col {}: weakly dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }
      else if(lp.lower(j) > R(-infinity) && EQrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM50 col {}: weakly dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }

      // fix column
      if(EQrel(lp.lower(j), lp.upper(j), feastol()))
      {
#if SOPLEX_FIX_VARIABLE
         fixColumn(lp, j);

         ++remCols;
         remNzos += lp.colVector(j).size();
         removeCol(lp, j);

         ++m_stat[FIX_COL];
#endif
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (dual) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}